

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.cpp
# Opt level: O1

void baryonyx::context_set_solver_parameters(context_ptr *ctx,solver_parameters *params)

{
  double dVar1;
  double dVar2;
  context *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined8 in_XMM5_Qb;
  
  auVar8._8_8_ = 0;
  auVar8._0_8_ = params->time_limit;
  uVar4 = vcmpsd_avx512f(auVar8,ZEXT816(0) << 0x40,6);
  bVar5 = (bool)((byte)uVar4 & 1);
  pcVar3 = (ctx->_M_t).super___uniq_ptr_impl<baryonyx::context,_void_(*)(baryonyx::context_*)>._M_t.
           super__Tuple_impl<0UL,_baryonyx::context_*,_void_(*)(baryonyx::context_*)>.
           super__Head_base<0UL,_baryonyx::context_*,_false>._M_head_impl;
  (pcVar3->parameters).time_limit =
       (double)((ulong)bVar5 * (long)params->time_limit + (ulong)!bVar5 * 0x7ff0000000000000);
  dVar1 = params->theta;
  if ((0.0 <= dVar1) && (dVar1 <= 1.0)) {
    (pcVar3->parameters).theta = dVar1;
  }
  dVar1 = params->delta;
  if (((dVar1 == -1.0) && (!NAN(dVar1))) || (0.0 <= dVar1)) {
    (pcVar3->parameters).delta = dVar1;
  }
  dVar1 = params->kappa_max;
  auVar8 = ZEXT816(0x3ff0000000000000);
  if ((((dVar1 <= 1.0) && (dVar20 = params->kappa_min, dVar20 < 1.0)) &&
      ((0.0 <= dVar20 && ((dVar20 < dVar1 && (dVar2 = params->kappa_step, 0.0 <= dVar2)))))) &&
     (dVar2 < 1.0)) {
    (pcVar3->parameters).kappa_min = dVar20;
    (pcVar3->parameters).kappa_step = dVar2;
    (pcVar3->parameters).kappa_max = dVar1;
  }
  if (0.0 <= params->alpha) {
    (pcVar3->parameters).alpha = params->alpha;
  }
  if ((ulong)ABS(params->pushing_k_factor) < 0x7ff0000000000000) {
    (pcVar3->parameters).pushing_k_factor = params->pushing_k_factor;
  }
  if ((ulong)ABS(params->pushing_objective_amplifier) < 0x7ff0000000000000) {
    (pcVar3->parameters).pushing_objective_amplifier = params->pushing_objective_amplifier;
  }
  if ((ulong)ABS(params->init_crossover_bastert_insertion) < 0x7ff0000000000000) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = params->init_crossover_bastert_insertion;
    uVar4 = vcmpsd_avx512f(auVar8,auVar9,1);
    bVar5 = (bool)((byte)uVar4 & 1);
    uVar4 = vcmpsd_avx512f(auVar9,ZEXT816(0) << 0x40,1);
    (pcVar3->parameters).init_crossover_bastert_insertion =
         (double)((ulong)!(bool)((byte)uVar4 & 1) *
                 ((ulong)bVar5 * 0x3ff0000000000000 +
                 (ulong)!bVar5 * (long)params->init_crossover_bastert_insertion));
  }
  if ((ulong)ABS(params->init_crossover_solution_selection_mean) < 0x7ff0000000000000) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = params->init_crossover_solution_selection_mean;
    uVar4 = vcmpsd_avx512f(auVar8,auVar10,1);
    bVar5 = (bool)((byte)uVar4 & 1);
    uVar4 = vcmpsd_avx512f(auVar10,ZEXT816(0) << 0x40,1);
    (pcVar3->parameters).init_crossover_solution_selection_mean =
         (double)((ulong)!(bool)((byte)uVar4 & 1) *
                 ((ulong)bVar5 * 0x3ff0000000000000 +
                 (ulong)!bVar5 * (long)params->init_crossover_solution_selection_mean));
  }
  if ((ulong)ABS(params->init_crossover_solution_selection_stddev) < 0x7ff0000000000000) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = params->init_crossover_solution_selection_stddev;
    uVar4 = vcmpsd_avx512f(auVar8,auVar11,1);
    bVar5 = (bool)((byte)uVar4 & 1);
    uVar4 = vcmpsd_avx512f(auVar11,ZEXT816(0) << 0x40,1);
    (pcVar3->parameters).init_crossover_solution_selection_stddev =
         (double)((ulong)!(bool)((byte)uVar4 & 1) *
                 ((ulong)bVar5 * 0x3ff0000000000000 +
                 (ulong)!bVar5 * (long)params->init_crossover_solution_selection_stddev));
  }
  if ((ulong)ABS(params->init_mutation_variable_mean) < 0x7ff0000000000000) {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = params->init_mutation_variable_mean;
    uVar4 = vcmpsd_avx512f(auVar8,auVar12,1);
    bVar5 = (bool)((byte)uVar4 & 1);
    uVar4 = vcmpsd_avx512f(auVar12,ZEXT816(0) << 0x40,1);
    (pcVar3->parameters).init_mutation_variable_mean =
         (double)((ulong)!(bool)((byte)uVar4 & 1) *
                 ((ulong)bVar5 * 0x3ff0000000000000 +
                 (ulong)!bVar5 * (long)params->init_mutation_variable_mean));
  }
  if ((ulong)ABS(params->init_mutation_variable_stddev) < 0x7ff0000000000000) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = params->init_mutation_variable_stddev;
    uVar4 = vcmpsd_avx512f(auVar8,auVar13,1);
    bVar5 = (bool)((byte)uVar4 & 1);
    uVar4 = vcmpsd_avx512f(auVar13,ZEXT816(0) << 0x40,1);
    (pcVar3->parameters).init_mutation_variable_stddev =
         (double)((ulong)!(bool)((byte)uVar4 & 1) *
                 ((ulong)bVar5 * 0x3ff0000000000000 +
                 (ulong)!bVar5 * (long)params->init_mutation_variable_stddev));
  }
  if ((ulong)ABS(params->init_mutation_value_mean) < 0x7ff0000000000000) {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = params->init_mutation_value_mean;
    uVar4 = vcmpsd_avx512f(auVar8,auVar14,1);
    bVar5 = (bool)((byte)uVar4 & 1);
    uVar4 = vcmpsd_avx512f(auVar14,ZEXT816(0) << 0x40,1);
    (pcVar3->parameters).init_mutation_value_mean =
         (double)((ulong)!(bool)((byte)uVar4 & 1) *
                 ((ulong)bVar5 * 0x3ff0000000000000 +
                 (ulong)!bVar5 * (long)params->init_mutation_value_mean));
  }
  if ((ulong)ABS(params->init_mutation_value_stddev) < 0x7ff0000000000000) {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = params->init_mutation_value_stddev;
    uVar4 = vcmpsd_avx512f(auVar8,auVar15,1);
    bVar5 = (bool)((byte)uVar4 & 1);
    uVar4 = vcmpsd_avx512f(auVar15,ZEXT816(0) << 0x40,1);
    (pcVar3->parameters).init_mutation_value_stddev =
         (double)((ulong)!(bool)((byte)uVar4 & 1) *
                 ((ulong)bVar5 * 0x3ff0000000000000 +
                 (ulong)!bVar5 * (long)params->init_mutation_value_stddev));
  }
  dVar1 = params->init_policy_random;
  dVar20 = 0.0;
  if ((0.0 <= dVar1) && (dVar1 <= 1.0)) {
    (pcVar3->parameters).init_policy_random = dVar1;
  }
  (pcVar3->parameters).seed = params->seed;
  (pcVar3->parameters).thread = params->thread;
  lVar6 = 0x7fffffffffffffff;
  if (0 < params->limit) {
    lVar6 = params->limit;
  }
  (pcVar3->parameters).limit = lVar6;
  if (-1 < params->print_level) {
    (pcVar3->parameters).print_level = params->print_level;
  }
  dVar1 = params->w;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  if (0.0 <= dVar1) {
    if (params->limit < 1) {
      auVar9 = vroundsd_avx(auVar16,auVar16,9);
      dVar20 = auVar9._0_8_;
    }
    else {
      auVar21._0_8_ = (double)params->limit;
      auVar21._8_8_ = in_XMM5_Qb;
      if (1.0 <= dVar1) {
        auVar9 = vminsd_avx(auVar16,auVar21);
        dVar20 = auVar9._0_8_;
      }
      else {
        dVar20 = dVar1 * auVar21._0_8_;
      }
    }
  }
  (pcVar3->parameters).w = dVar20;
  (pcVar3->parameters).pushes_limit = ~(params->pushes_limit >> 0x1f) & params->pushes_limit;
  (pcVar3->parameters).pushing_iteration_limit =
       ~(params->pushing_iteration_limit >> 0x1f) & params->pushing_iteration_limit;
  if (4 < params->init_population_size) {
    (pcVar3->parameters).init_population_size = params->init_population_size;
  }
  auVar17._8_8_ = 0;
  auVar17._0_8_ = params->init_kappa_improve_start;
  auVar9 = vminsd_avx(auVar8,auVar17);
  uVar4 = vcmpsd_avx512f(auVar17,ZEXT816(0) << 0x40,1);
  dVar1 = (double)((ulong)!(bool)((byte)uVar4 & 1) * auVar9._0_8_);
  auVar7._8_8_ = auVar9._8_8_;
  auVar7._0_8_ = dVar1;
  (pcVar3->parameters).init_kappa_improve_start = dVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = params->init_kappa_improve_increase;
  auVar9 = vminsd_avx(auVar8,auVar18);
  uVar4 = vcmpsd_avx512f(auVar18,ZEXT816(0) << 0x40,1);
  (pcVar3->parameters).init_kappa_improve_increase =
       (double)((ulong)!(bool)((byte)uVar4 & 1) * auVar9._0_8_);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = params->init_kappa_improve_stop;
  auVar8 = vminsd_avx(auVar8,auVar19);
  uVar4 = vcmpsd_avx512f(auVar19,auVar7,1);
  bVar5 = (bool)((byte)uVar4 & 1);
  (pcVar3->parameters).init_kappa_improve_stop =
       (double)((ulong)bVar5 * (long)dVar1 + (ulong)!bVar5 * auVar8._0_8_);
  (pcVar3->parameters).pre_order = params->pre_order;
  (pcVar3->parameters).order = params->order;
  (pcVar3->parameters).float_type = params->float_type;
  (pcVar3->parameters).init_policy = params->init_policy;
  (pcVar3->parameters).cost_norm = params->cost_norm;
  (pcVar3->parameters).mode = params->mode;
  (pcVar3->parameters).preprocessor = params->preprocessor;
  (pcVar3->parameters).observer = params->observer;
  (pcVar3->parameters).storage = params->storage;
  (pcVar3->parameters).solver = params->solver;
  (pcVar3->parameters).debug = params->debug;
  return;
}

Assistant:

void
context_set_solver_parameters(const context_ptr& ctx,
                              const solver_parameters& params)
{
    ctx->parameters.time_limit = params.time_limit <= 0
                                   ? std::numeric_limits<double>::infinity()
                                   : params.time_limit;

    if (params.theta >= 0 && params.theta <= 1)
        ctx->parameters.theta = params.theta;

    if (params.delta == -1 || params.delta >= 0)
        ctx->parameters.delta = params.delta;

    if (params.kappa_min < params.kappa_max && params.kappa_min >= 0 &&
        params.kappa_min < 1 && params.kappa_max <= 1 &&
        params.kappa_step >= 0 && params.kappa_step < 1) {
        ctx->parameters.kappa_min = params.kappa_min;
        ctx->parameters.kappa_step = params.kappa_step;
        ctx->parameters.kappa_max = params.kappa_max;
    }

    if (params.alpha >= 0)
        ctx->parameters.alpha = params.alpha;

    if (std::isfinite(params.pushing_k_factor))
        ctx->parameters.pushing_k_factor = params.pushing_k_factor;

    if (std::isfinite(params.pushing_objective_amplifier))
        ctx->parameters.pushing_objective_amplifier =
          params.pushing_objective_amplifier;

    if (std::isfinite(params.init_crossover_bastert_insertion))
        ctx->parameters.init_crossover_bastert_insertion =
          std::clamp(params.init_crossover_bastert_insertion, 0.0, 1.0);

    if (std::isfinite(params.init_crossover_solution_selection_mean))
        ctx->parameters.init_crossover_solution_selection_mean =
          std::clamp(params.init_crossover_solution_selection_mean, 0.0, 1.0);

    if (std::isfinite(params.init_crossover_solution_selection_stddev))
        ctx->parameters.init_crossover_solution_selection_stddev = std::clamp(
          params.init_crossover_solution_selection_stddev, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_variable_mean))
        ctx->parameters.init_mutation_variable_mean =
          std::clamp(params.init_mutation_variable_mean, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_variable_stddev))
        ctx->parameters.init_mutation_variable_stddev =
          std::clamp(params.init_mutation_variable_stddev, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_value_mean))
        ctx->parameters.init_mutation_value_mean =
          std::clamp(params.init_mutation_value_mean, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_value_stddev))
        ctx->parameters.init_mutation_value_stddev =
          std::clamp(params.init_mutation_value_stddev, 0.0, 1.0);

    if (params.init_policy_random >= 0 && params.init_policy_random <= 1)
        ctx->parameters.init_policy_random = params.init_policy_random;

    ctx->parameters.seed = params.seed;
    ctx->parameters.thread = params.thread;

    ctx->parameters.limit = (params.limit <= 0)
                              ? std::numeric_limits<long int>::max()
                              : params.limit;

    if (params.print_level >= 0)
        ctx->parameters.print_level = params.print_level;

    // Convert the value [0..1] into a percentage of loop or use directly the
    // number if the value.

    if (params.w < 0) {
        ctx->parameters.w = 0;
    } else {
        if (params.limit > 0) {
            auto limit = static_cast<double>(params.limit);

            if (params.w < 1)
                ctx->parameters.w = limit * params.w;
            else
                ctx->parameters.w = std::min(limit, params.w);
        } else {
            ctx->parameters.w = std::floor(params.w);
        }
    }

    ctx->parameters.pushes_limit =
      params.pushes_limit <= 0 ? 0 : params.pushes_limit;

    ctx->parameters.pushing_iteration_limit =
      params.pushing_iteration_limit <= 0 ? 0 : params.pushing_iteration_limit;

    if (params.init_population_size >= 5)
        ctx->parameters.init_population_size = params.init_population_size;

    ctx->parameters.init_kappa_improve_start =
      std::clamp(params.init_kappa_improve_start, 0.0, 1.0);

    ctx->parameters.init_kappa_improve_increase =
      std::clamp(params.init_kappa_improve_increase, 0.0, 1.0);

    ctx->parameters.init_kappa_improve_stop =
      std::clamp(params.init_kappa_improve_stop,
                 ctx->parameters.init_kappa_improve_start,
                 1.0);

    ctx->parameters.pre_order = params.pre_order;
    ctx->parameters.order = params.order;
    ctx->parameters.float_type = params.float_type;
    ctx->parameters.init_policy = params.init_policy;
    ctx->parameters.cost_norm = params.cost_norm;
    ctx->parameters.mode = params.mode;
    ctx->parameters.preprocessor = params.preprocessor;
    ctx->parameters.observer = params.observer;
    ctx->parameters.storage = params.storage;
    ctx->parameters.solver = params.solver;
    ctx->parameters.debug = params.debug;
}